

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string *psVar4;
  allocator local_49;
  string local_48 [55];
  Colour local_11;
  ConsoleReporter *pCStack_10;
  Colour colour;
  ConsoleReporter *this_local;
  
  pCStack_10 = this;
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  pcVar3 = getLineOfChars<(char)126>();
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\n");
  Colour::Colour(&local_11,FileName);
  poVar2 = (this->super_StreamingReporterBase).stream;
  psVar4 = (string *)
           Option<Catch::TestRunInfo>::operator->
                     (&(this->super_StreamingReporterBase).currentTestRunInfo.
                       super_Option<Catch::TestRunInfo>);
  poVar2 = std::operator<<(poVar2,psVar4);
  poVar2 = std::operator<<(poVar2," is a Catch v");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,libraryVersion);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,DAT_002335ec);
  poVar2 = std::operator<<(poVar2," b");
  std::ostream::operator<<(poVar2,DAT_002335f0);
  pcVar3 = DAT_002335f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"master",&local_49);
  bVar1 = std::operator!=(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (bVar1) {
    poVar2 = std::operator<<((this->super_StreamingReporterBase).stream," (");
    poVar2 = std::operator<<(poVar2,DAT_002335f8);
    std::operator<<(poVar2,")");
  }
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream," host application.\n");
  std::operator<<(poVar2,"Run with -? for options\n\n");
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::~Colour(&local_11);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getLineOfChars<'~'>() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            currentTestRunInfo.used = true;
        }